

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response_test.cpp
# Opt level: O1

void __thiscall test_app::reset_context(test_app *this,bool async,bool gzip,bool set_cache)

{
  bool bVar1;
  undefined8 uVar2;
  string *psVar3;
  undefined7 in_register_00000031;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  set_context(this,false,false);
  if ((int)CONCAT71(in_register_00000031,async) == 0) {
    if (!gzip) {
      uVar2 = cppcms::application::response();
      cppcms::http::response::io_mode(uVar2,1);
    }
  }
  else {
    uVar2 = cppcms::application::response();
    cppcms::http::response::io_mode(uVar2,3);
    bVar1 = (bool)cppcms::application::response();
    cppcms::http::response::full_asynchronous_buffering(bVar1);
  }
  if (set_cache) {
    psVar3 = (string *)cppcms::application::cache();
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"none","");
    cppcms::cache_interface::fetch_page(psVar3);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  cppcms::application::response();
  cppcms::http::response::out();
  std::ostream::flush();
  ignore_headers(this);
  return;
}

Assistant:

void reset_context(bool async,bool gzip,bool set_cache)
	{
		set_context(false,false);
		if(async) {
			response().io_mode(cppcms::http::response::asynchronous);
			response().full_asynchronous_buffering(false);
		}
		else {
			if(!gzip)
				response().io_mode(cppcms::http::response::nogzip);
		}
		if(set_cache)
			cache().fetch_page("none");
		response().out() << std::flush;
		ignore_headers();	
	}